

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *ctx_00;
  TestContext *testCtx;
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  PointCase *pPVar4;
  FillRuleCase *pFVar5;
  CullingTest *this_00;
  char *pcVar6;
  TriangleInterpolationTest *pTVar7;
  LineInterpolationTest *pLVar8;
  ulong extraout_RAX;
  char *description;
  ulong uVar9;
  TestCaseGroup *interpolation_1;
  TestCaseGroup *fillRules_1;
  TestCaseGroup *primitiveGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  TestNode *local_e8;
  TestCaseGroup *colorAttachmentGroup;
  TestNode *pTStack_d8;
  int targetNdx;
  TestCaseGroup *fboGroup;
  TestCaseGroup *flatshading;
  TestCaseGroup *projected;
  TestCaseGroup *basic;
  TestCaseGroup *interpolation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  int local_40;
  int frontOrderNdx;
  int primitiveNdx;
  int cullModeNdx;
  TestCaseGroup *culling;
  TestCaseGroup *fillRules;
  TestCaseGroup *primitives;
  RasterizationTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0xd8);
  anon_unknown_1::TrianglesCase::TrianglesCase
            ((TrianglesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result",RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xd8);
  anon_unknown_1::TriangleStripCase::TriangleStripCase
            ((TriangleStripCase *)pTVar3,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result",
             RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xd8);
  anon_unknown_1::TriangleFanCase::TriangleFanCase
            ((TriangleFanCase *)pTVar3,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result",
             RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",PRIMITIVEWIDENESS_NARROW,
             RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar3,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar3,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar3,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar3,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pPVar4 = (PointCase *)operator_new(0xf0);
  anon_unknown_1::PointCase::PointCase
            (pPVar4,(this->super_TestCaseGroup).m_context,"points",
             "Render primitives as GL_POINTS, verify rasterization result",PRIMITIVEWIDENESS_WIDE,
             RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pFVar5 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"basic_quad","Verify fill rules",
             FILLRULECASE_BASIC,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
  pFVar5 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"basic_quad_reverse","Verify fill rules",
             FILLRULECASE_REVERSED,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
  pFVar5 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"clipped_full","Verify fill rules",
             FILLRULECASE_CLIPPED_FULL,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
  pFVar5 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"clipped_partly","Verify fill rules",
             FILLRULECASE_CLIPPED_PARTIAL,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
  pFVar5 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"projected","Verify fill rules",
             FILLRULECASE_PROJECTED,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (frontOrderNdx = 0; frontOrderNdx < 3; frontOrderNdx = frontOrderNdx + 1) {
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        pcVar6 = init::cullModes[frontOrderNdx].prefix;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,pcVar6,(allocator<char> *)((long)&interpolation + 7));
        std::operator+(&local_88,&local_a8,init::primitiveTypes[local_40].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,init::frontOrders[(int)name.field_2._12_4_].postfix);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&interpolation + 7));
        this_00 = (CullingTest *)operator_new(0xd0);
        ctx_00 = (this->super_TestCaseGroup).m_context;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::CullingTest::CullingTest
                  (this_00,ctx_00,pcVar6,"Test primitive culling.",
                   init::cullModes[frontOrderNdx].mode,init::primitiveTypes[local_40].type,
                   init::frontOrders[(int)name.field_2._12_4_].mode);
        tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolation","Test interpolation");
  basic = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Non-projective interpolation");
  projected = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild(&basic->super_TestNode,pTVar2);
  pTVar1 = projected;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangles",
             "Verify triangle interpolation",4,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = projected;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Verify triangle strip interpolation",5,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = projected;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Verify triangle fan interpolation",6,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines","Verify line interpolation",1,0,
             PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip",
             "Verify line strip interpolation",3,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop",
             "Verify line loop interpolation",2,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = projected;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"projected",
             "Projective interpolation");
  flatshading = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild(&basic->super_TestNode,pTVar2);
  pTVar1 = flatshading;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangles",
             "Verify triangle interpolation",4,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = flatshading;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Verify triangle strip interpolation",5,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = flatshading;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Verify triangle fan interpolation",6,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines","Verify line interpolation",1,2,
             PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip",
             "Verify line strip interpolation",3,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop",
             "Verify line loop interpolation",2,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Verify wide line interpolation",1,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = flatshading;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"flatshading",
             "Test flatshading");
  fboGroup = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar1 = fboGroup;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangles","Verify triangle flatshading",
             4,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = fboGroup;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Verify triangle strip flatshading",5,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = fboGroup;
  pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar7,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Verify triangle fan flatshading",6,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar7);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines","Verify line flatshading",1,4,
             PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip",
             "Verify line strip flatshading",3,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop","Verify line loop flatshading"
             ,2,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Verify wide line flatshading",1,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Verify wide line strip flatshading",3,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1
            );
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar1 = fboGroup;
  pLVar8 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar8,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Verify wide line loop flatshading",2,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pLVar8);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fbo",
             "Test using framebuffer objects");
  pTStack_d8 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  colorAttachmentGroup._4_4_ = 0;
  uVar9 = extraout_RAX;
  while ((int)colorAttachmentGroup._4_4_ < 4) {
    pTVar2 = (TestNode *)operator_new(0x70);
    primitiveGroup._6_1_ = 1;
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar6 = init::renderTargets[(int)colorAttachmentGroup._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,pcVar6,(allocator<char> *)((long)&primitiveGroup + 7));
    std::operator+(&local_128,"Test using ",&local_148);
    std::operator+(&local_108,&local_128," color attachment");
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,pcVar6,description);
    primitiveGroup._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&primitiveGroup + 7));
    local_e8 = pTVar2;
    tcu::TestNode::addChild(pTStack_d8,pTVar2);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives"
               ,"Primitive rasterization");
    tcu::TestNode::addChild(local_e8,pTVar2);
    pTVar3 = (TestNode *)operator_new(0xd8);
    anon_unknown_1::TrianglesCase::TrianglesCase
              ((TrianglesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"triangles",
               "Render primitives as GL_TRIANGLES, verify rasterization result",
               init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    pTVar3 = (TestNode *)operator_new(0xf8);
    anon_unknown_1::LinesCase::LinesCase
              ((LinesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"lines",
               "Render primitives as GL_LINES, verify rasterization result",PRIMITIVEWIDENESS_NARROW
               ,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    pTVar3 = (TestNode *)operator_new(0xf8);
    anon_unknown_1::LinesCase::LinesCase
              ((LinesCase *)pTVar3,(this->super_TestCaseGroup).m_context,"lines_wide",
               "Render primitives as GL_LINES with wide lines, verify rasterization result",
               PRIMITIVEWIDENESS_WIDE,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    pPVar4 = (PointCase *)operator_new(0xf0);
    anon_unknown_1::PointCase::PointCase
              (pPVar4,(this->super_TestCaseGroup).m_context,"points",
               "Render primitives as GL_POINTS, verify rasterization result",PRIMITIVEWIDENESS_WIDE,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules"
               ,"Primitive fill rules");
    tcu::TestNode::addChild(local_e8,pTVar2);
    pFVar5 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar5,(this->super_TestCaseGroup).m_context,"basic_quad","Verify fill rules",
               FILLRULECASE_BASIC,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    pFVar5 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar5,(this->super_TestCaseGroup).m_context,"basic_quad_reverse","Verify fill rules"
               ,FILLRULECASE_REVERSED,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    pFVar5 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar5,(this->super_TestCaseGroup).m_context,"clipped_full","Verify fill rules",
               FILLRULECASE_CLIPPED_FULL,init::renderTargets[(int)colorAttachmentGroup._4_4_].target
               ,init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    pFVar5 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar5,(this->super_TestCaseGroup).m_context,"clipped_partly","Verify fill rules",
               FILLRULECASE_CLIPPED_PARTIAL,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    pFVar5 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar5,(this->super_TestCaseGroup).m_context,"projected","Verify fill rules",
               FILLRULECASE_PROJECTED,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               "interpolation","Non-projective interpolation");
    tcu::TestNode::addChild(local_e8,pTVar2);
    pTVar7 = (TriangleInterpolationTest *)operator_new(0xd8);
    anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
              (pTVar7,(this->super_TestCaseGroup).m_context,"triangles",
               "Verify triangle interpolation",4,0,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar7);
    pLVar8 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar8,(this->super_TestCaseGroup).m_context,"lines","Verify line interpolation",1,0,
               PRIMITIVEWIDENESS_NARROW,init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar8);
    pLVar8 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar8,(this->super_TestCaseGroup).m_context,"lines_wide",
               "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].target,
               init::renderTargets[(int)colorAttachmentGroup._4_4_].numSamples);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar8);
    colorAttachmentGroup._4_4_ = colorAttachmentGroup._4_4_ + 1;
    uVar9 = (ulong)colorAttachmentGroup._4_4_;
  }
  return (int)uVar9;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(m_testCtx, "flatshading", "Test flatshading");

		addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle flatshading",			GL_TRIANGLES,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip flatshading",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan flatshading",		GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line flatshading",				GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip flatshading",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop flatshading",			GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line flatshading",			GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip flatshading",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop flatshading",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	// .fbo
	{
		static const struct
		{
			const char*						name;
			BaseRenderingCase::RenderTarget	target;
			int								numSamples;
		} renderTargets[] =
		{
			{ "texture_2d",				BaseRenderingCase::RENDERTARGET_TEXTURE_2D,			-1									},
			{ "rbo_singlesample",		BaseRenderingCase::RENDERTARGET_RBO_SINGLESAMPLE,	-1									},
			{ "rbo_multisample_4",		BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	4									},
			{ "rbo_multisample_max",	BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	BaseRenderingCase::SAMPLE_COUNT_MAX	},
		};

		tcu::TestCaseGroup* const fboGroup = new tcu::TestCaseGroup(m_testCtx, "fbo", "Test using framebuffer objects");
		addChild(fboGroup);

		// .texture_2d
		// .rbo_singlesample
		// .rbo_multisample_4
		// .rbo_multisample_max
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++targetNdx)
		{
			tcu::TestCaseGroup* const colorAttachmentGroup = new tcu::TestCaseGroup(m_testCtx, renderTargets[targetNdx].name, ("Test using " + std::string(renderTargets[targetNdx].name) + " color attachment").c_str());
			fboGroup->addChild(colorAttachmentGroup);

			// .primitives
			{
				tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");
				colorAttachmentGroup->addChild(primitiveGroup);

				primitiveGroup->addChild(new TrianglesCase	(m_context, "triangles",	"Render primitives as GL_TRIANGLES, verify rasterization result",											renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines",		"Render primitives as GL_LINES, verify rasterization result",					PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines_wide",	"Render primitives as GL_LINES with wide lines, verify rasterization result",	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new PointCase		(m_context, "points",		"Render primitives as GL_POINTS, verify rasterization result",					PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .fill_rules
			{
				tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

				colorAttachmentGroup->addChild(fillRules);

				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC,			renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .interpolation
			{
				tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Non-projective interpolation");

				colorAttachmentGroup->addChild(interpolation);

				interpolation->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE,								renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}
		}
	}
}